

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::log<char[24]>(ConsoleLogger *this,char (*args) [24])

{
  char (*args_local) [24];
  ConsoleLogger *this_local;
  
  if (this->loglevel < 1) {
    std::mutex::lock(&this->mtx);
    std::operator<<(this->out,"    ");
    print<char[24]>(this,args);
    std::mutex::unlock(&this->mtx);
  }
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}